

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# statistics.hpp
# Opt level: O2

void __thiscall inja::StatisticsVisitor::visit(StatisticsVisitor *this,FunctionNode *node)

{
  pointer psVar1;
  element_type *peVar2;
  shared_ptr<inja::ExpressionNode> *n;
  pointer psVar3;
  
  psVar1 = (node->arguments).
           super__Vector_base<std::shared_ptr<inja::ExpressionNode>,_std::allocator<std::shared_ptr<inja::ExpressionNode>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (psVar3 = (node->arguments).
                super__Vector_base<std::shared_ptr<inja::ExpressionNode>,_std::allocator<std::shared_ptr<inja::ExpressionNode>_>_>
                ._M_impl.super__Vector_impl_data._M_start; psVar3 != psVar1; psVar3 = psVar3 + 1) {
    peVar2 = (psVar3->super___shared_ptr<inja::ExpressionNode,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
    (**(peVar2->super_AstNode)._vptr_AstNode)(peVar2,this);
  }
  return;
}

Assistant:

void visit(const FunctionNode& node) {
    for (const auto& n : node.arguments) {
      n->accept(*this);
    }
  }